

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O3

vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_> *
slack::_detail::json_to_elements
          (vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>
           *__return_storage_ptr__,Json *json)

{
  value_t vVar1;
  pointer pcVar2;
  bool bVar3;
  key_type *pkVar4;
  reference j;
  undefined8 uVar5;
  size_type sVar6;
  size_t sVar7;
  string label;
  const_iterator it;
  const_iterator result_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  undefined1 *local_218;
  long local_210;
  undefined1 local_208 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_1d8;
  undefined1 local_1b8 [16];
  iterator iStack_1a8;
  primitive_iterator_t local_1a0;
  ios_base local_138 [264];
  
  (__return_storage_ptr__->
  super__Vector_base<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vVar1 = json->m_type;
  sVar7 = (size_t)vVar1;
  if (vVar1 != null) {
    if (vVar1 == object) {
      sVar7 = (((json->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    }
    else if (vVar1 == array) {
      sVar7 = (long)(((json->m_value).array)->
                    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(((json->m_value).array)->
                    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4;
    }
    else {
      sVar7 = 1;
    }
  }
  std::vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>::reserve
            (__return_storage_ptr__,sVar7 + 1);
  local_1d8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_1d8.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        *)0x0;
  local_1d8.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_1d8.m_object = json;
  nlohmann::detail::
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::set_begin(&local_1d8);
  do {
    local_1b8._8_8_ = (_Base_ptr)0x0;
    iStack_1a8._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)0x0;
    local_1a0.m_it = -0x8000000000000000;
    local_1b8._0_8_ = json;
    nlohmann::detail::
    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::set_end((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)local_1b8);
    bVar3 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::operator==(&local_1d8,
                         (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_1b8);
    if (bVar3) {
      return __return_storage_ptr__;
    }
    pkVar4 = nlohmann::detail::
             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::key(&local_1d8);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    pcVar2 = (pkVar4->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,pcVar2,pcVar2 + pkVar4->_M_string_length);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    j = nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator*(&local_1d8);
    nlohmann::operator<<((ostream *)&iStack_1a8,j);
    std::__cxx11::stringbuf::str();
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_238,local_218,local_218 + local_210);
    if (*local_238._M_dataplus._M_p == '\"') {
      std::__cxx11::string::erase((ulong)&local_238,0);
      sVar6 = local_238._M_string_length - 1;
      if (local_238._M_string_length == 0) {
        uVar5 = std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                           "basic_string::erase",sVar6,0);
        std::vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>::~vector
                  (__return_storage_ptr__);
        _Unwind_Resume(uVar5);
      }
      local_238._M_dataplus._M_p[sVar6] = '\0';
      local_238._M_string_length = sVar6;
    }
    std::vector<slack::_detail::Element,std::allocator<slack::_detail::Element>>::
    emplace_back<std::__cxx11::string&,std::__cxx11::string>
              ((vector<slack::_detail::Element,std::allocator<slack::_detail::Element>> *)
               __return_storage_ptr__,&local_1f8,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    if (local_218 != local_208) {
      operator_delete(local_218);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    nlohmann::detail::
    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++(&local_1d8);
  } while( true );
}

Assistant:

inline
auto json_to_elements(const Json& json) -> std::vector<Element> {
    auto elements = std::vector<Element>{};
    elements.reserve(json.size() + 1); // +1 for token
    for (auto it = json.begin(); it != json.end(); ++ it) { 
        std::string label = it.key();
        std::stringstream ss_value;
        ss_value << it.value();
        elements.emplace_back(label, remove_first_last_quote(ss_value.str()));
    }
    return elements;
}